

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

ecs_query_t * ecs_subquery_new(ecs_world_t *world,ecs_query_t *parent,char *expr)

{
  uint uVar1;
  ecs_query_t *query;
  undefined8 *puVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ecs_sig_t sig;
  
  sig.name = (char *)0x0;
  sig.expr = (char *)0x0;
  sig.columns = (ecs_vector_t *)0x0;
  lVar5 = 0;
  ecs_sig_init(world,(char *)0x0,expr,&sig);
  query = ecs_query_new_w_sig_intern(world,0,&sig,true);
  query->parent = parent;
  puVar2 = (undefined8 *)_ecs_vector_add(&parent->subqueries,8,0x10);
  *puVar2 = query;
  pvVar3 = _ecs_vector_first(parent->tables,0x50,0x10);
  uVar1 = ecs_vector_count(parent->tables);
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 * 0x50 - lVar5 != 0; lVar5 = lVar5 + 0x50) {
    match_table(world,query,*(ecs_table_t **)((long)pvVar3 + lVar5 + 8));
    activate_table(world,query,*(ecs_table_t **)((long)pvVar3 + lVar5 + 8),true);
  }
  pvVar3 = _ecs_vector_first(parent->empty_tables,0x50,0x10);
  uVar1 = ecs_vector_count(parent->empty_tables);
  uVar6 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 * 0x50 - uVar6 != 0; uVar6 = uVar6 + 0x50) {
    match_table(world,query,*(ecs_table_t **)((long)pvVar3 + uVar6 + 8));
  }
  return query;
}

Assistant:

ecs_query_t* ecs_subquery_new(
    ecs_world_t *world,
    ecs_query_t *parent,
    const char *expr)
{
    ecs_sig_t sig = { 0 };
    ecs_sig_init(world, NULL, expr, &sig);
    ecs_query_t *result = ecs_query_new_w_sig_intern(world, 0, &sig, true);
    result->parent = parent;
    add_subquery(world, parent, result);
    return result;
}